

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this_ipp.hpp
# Opt level: O2

shared_ptr<duckdb::Pipeline,_true> __thiscall
duckdb::enable_shared_from_this<duckdb::Pipeline>::shared_from_this
          (enable_shared_from_this<duckdb::Pipeline> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<duckdb::Pipeline,_true> sVar1;
  __weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ::std::__weak_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr(&local_20,in_RSI);
  ::std::__shared_ptr<duckdb::Pipeline,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::Pipeline,void>
            ((__shared_ptr<duckdb::Pipeline,(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_20._M_refcount);
  sVar1.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Pipeline,_true>)
         sVar1.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T> shared_from_this() { // NOLINT: invalid case style
		return shared_ptr<T>(__weak_this_);
	}